

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O1

Config * ProgramOptions::parseCommandLine(Config *__return_storage_ptr__,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  __node_base *p_Var2;
  pointer pSVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  pointer pbVar6;
  Color CVar7;
  int iVar8;
  OptionAdder *pOVar9;
  size_t sVar10;
  runtime_error *this;
  ostream *poVar11;
  DataFormat DVar12;
  KerningPairs KVar13;
  code *pcVar14;
  TextureNameSuffix TVar15;
  pointer_____offset_0x10___ *ppuVar16;
  size_type sVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  string *fileName;
  string dataFormat;
  string kerningPairs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  charsFile;
  string textureNameSuffix;
  string charsFileOptionName;
  string chars;
  string textureSizeListOptionName;
  string charsOptionName;
  string backgroundColorOptionName;
  string backgroundColor;
  string textureSizeList;
  string color;
  ParseResult result;
  Options options;
  string local_1370;
  __node_base *local_1350;
  pointer local_1348;
  __node_base local_1340;
  undefined4 uStack_1338;
  undefined4 uStack_1334;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  uint32_t *local_1310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  string local_12e8;
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [8];
  undefined1 auStack_12b0 [12];
  undefined4 uStack_12a4;
  bool bStack_12a0;
  undefined7 uStack_129f;
  undefined1 local_1298 [32];
  _Alloc_hider local_1278;
  size_t sStack_1270;
  undefined1 local_1268 [16];
  _Alloc_hider _Stack_1258;
  __node_base local_1250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1248;
  size_t sStack_1238;
  __node_base_ptr local_1230;
  element_type *local_1228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1218;
  pointer pbStack_1210;
  pointer local_1208;
  pointer pbStack_1200;
  element_type *local_11f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_11f0;
  __node_base local_11e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_11e0;
  _Prime_rehash_policy local_11d8;
  element_type *local_11c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_11c0;
  undefined1 local_11b8 [16];
  _Base_ptr local_11a8;
  _Base_ptr p_Stack_11a0;
  element_type *local_1198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1190;
  element_type *local_1188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1180;
  element_type *local_1178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1170;
  __node_base local_1168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1160;
  element_type *local_1158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1150;
  element_type *local_1148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1140;
  element_type *local_1138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1130;
  element_type *local_1128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1120;
  element_type *local_1118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1110;
  element_type *local_1108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1100;
  element_type *local_10f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10f0;
  element_type *local_10e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10e0;
  element_type *local_10d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10d0;
  element_type *local_10c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10c0;
  element_type *local_10b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10b0;
  element_type *local_10a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10a0;
  element_type *local_1098;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1090;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1068;
  string local_1048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028;
  _Base_ptr local_1008;
  Alignment *local_1000;
  long *local_ff8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ff0;
  shared_ptr<const_cxxopts::Value> local_fe8;
  shared_ptr<const_cxxopts::Value> local_fd8;
  shared_ptr<const_cxxopts::Value> local_fc8;
  shared_ptr<const_cxxopts::Value> local_fb8;
  shared_ptr<const_cxxopts::Value> local_fa8;
  shared_ptr<const_cxxopts::Value> local_f98;
  shared_ptr<const_cxxopts::Value> local_f88;
  shared_ptr<const_cxxopts::Value> local_f78;
  shared_ptr<const_cxxopts::Value> local_f68;
  shared_ptr<const_cxxopts::Value> local_f58;
  long *local_f48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f40;
  shared_ptr<const_cxxopts::Value> local_f38;
  long *local_f28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f20;
  shared_ptr<const_cxxopts::Value> local_f18;
  shared_ptr<const_cxxopts::Value> local_f08;
  long *local_ef8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ef0;
  shared_ptr<const_cxxopts::Value> local_ee8;
  long *local_ed8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ed0;
  shared_ptr<const_cxxopts::Value> local_ec8;
  long *local_eb8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_eb0;
  shared_ptr<const_cxxopts::Value> local_ea8;
  long *local_e98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e90;
  shared_ptr<const_cxxopts::Value> local_e88;
  long *local_e78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e70;
  shared_ptr<const_cxxopts::Value> local_e68;
  long *local_e58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e50;
  shared_ptr<const_cxxopts::Value> local_e48;
  long *local_e38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e30;
  shared_ptr<const_cxxopts::Value> local_e28;
  shared_ptr<const_cxxopts::Value> local_e18;
  long *local_e08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e00;
  shared_ptr<const_cxxopts::Value> local_df8;
  shared_ptr<const_cxxopts::Value> local_de8;
  shared_ptr<const_cxxopts::Value> local_dd8;
  shared_ptr<const_cxxopts::Value> local_dc8;
  shared_ptr<const_cxxopts::Value> local_db8;
  string local_da8;
  string local_d88;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  undefined1 *local_9e8 [2];
  undefined1 local_9d8 [16];
  string local_9c8;
  string local_9a8;
  string local_988;
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  string local_868;
  string local_848;
  string local_828;
  undefined1 *local_808 [2];
  undefined1 local_7f8 [16];
  string local_7e8;
  string local_7c8;
  string local_7a8;
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  string local_768;
  string local_748;
  string local_728;
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  string local_6e8;
  string local_6c8;
  string local_6a8;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  string local_668;
  string local_648;
  string local_628;
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  string local_5e8;
  string local_5c8;
  string local_5a8;
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  ParseResult local_328;
  string local_288;
  string local_268;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  Options local_1a8;
  
  (__return_storage_ptr__->fontFile)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fontFile).field_2;
  (__return_storage_ptr__->fontFile)._M_string_length = 0;
  (__return_storage_ptr__->fontFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->backgroundTransparent = true;
  __return_storage_ptr__->fontSize = 0x10;
  (__return_storage_ptr__->padding).up = 0;
  (__return_storage_ptr__->padding).right = 0;
  (__return_storage_ptr__->padding).down = 0;
  (__return_storage_ptr__->padding).left = 0;
  (__return_storage_ptr__->spacing).ver = 0;
  (__return_storage_ptr__->spacing).hor = 0;
  (__return_storage_ptr__->alignment).ver = 1;
  (__return_storage_ptr__->alignment).hor = 1;
  (__return_storage_ptr__->textureSizeList).
  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->textureSizeList).
  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->textureSizeList).
  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->output).field_2;
  (__return_storage_ptr__->output)._M_string_length = 0;
  (__return_storage_ptr__->output).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->dataFormat = Text;
  __return_storage_ptr__->textureNameSuffix = IndexAligned;
  *(undefined8 *)((long)&__return_storage_ptr__->maxTextureCount + 2) = 0;
  __return_storage_ptr__->kerningPairs = Disabled;
  __return_storage_ptr__->maxTextureCount = 0;
  local_1028._M_dataplus._M_p = (pointer)&local_1028.field_2;
  local_1028._M_string_length = 0;
  local_1028.field_2._M_local_buf[0] = '\0';
  local_1088.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1088.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1088.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"background-color","");
  local_1048._M_dataplus._M_p = (pointer)&local_1048.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1048,"chars-file","");
  local_d88._M_dataplus._M_p = (pointer)&local_d88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d88,"chars","");
  local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da8,"texture-size","");
  local_1330._M_dataplus._M_p = (pointer)&local_1330.field_2;
  local_1330._M_string_length = 0;
  local_1330.field_2._M_local_buf[0] = '\0';
  local_1308._M_dataplus._M_p = (pointer)&local_1308.field_2;
  local_1308._M_string_length = 0;
  local_1308.field_2._M_local_buf[0] = '\0';
  local_1068._M_dataplus._M_p = (pointer)&local_1068.field_2;
  local_1068._M_string_length = 0;
  local_1068.field_2._M_local_buf[0] = '\0';
  local_1008 = &p_Var1->_M_header;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"fontbm","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"Command line bitmap font generator, compatible with bmfont","");
  cxxopts::Options::Options(&local_1a8,&local_1c8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  local_1350 = &local_1340;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1350,"");
  local_12b8 = (undefined1  [8])local_1348;
  p_Var2 = &local_328.m_keys._M_h._M_before_begin;
  if (local_1350 == &local_1340) {
    local_328.m_keys._M_h._M_element_count._0_4_ = uStack_1338;
    local_328.m_keys._M_h._M_element_count._4_4_ = uStack_1334;
    local_328.m_keys._M_h._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_328.m_keys._M_h._M_buckets = &local_1350->_M_nxt;
  }
  local_328.m_keys._M_h._M_bucket_count = (size_type)local_1348;
  local_1348 = (pointer)0x0;
  local_1340._M_nxt._0_4_ = (uint)local_1340._M_nxt & 0xffffff00;
  local_12c8._8_8_ = local_12b8 + 8;
  if ((__node_base *)local_328.m_keys._M_h._M_buckets == p_Var2) {
    uStack_12a4 = local_328.m_keys._M_h._M_element_count._4_4_;
    auStack_12b0._8_4_ = (undefined4)local_328.m_keys._M_h._M_element_count;
  }
  else {
    local_12c8._8_8_ = local_328.m_keys._M_h._M_buckets;
  }
  local_1350 = &local_1340;
  local_12c8._0_8_ = &local_1a8;
  local_328.m_keys._M_h._M_buckets = &p_Var2->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"help","");
  local_12e8._M_dataplus._M_p = (pointer)&local_12e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12e8,"produce help message","");
  cxxopts::value<bool>();
  local_db8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1098
  ;
  local_db8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1090;
  local_1098 = (element_type *)0x0;
  p_Stack_1090 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
  pOVar9 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_12c8,(string *)&local_328,&local_12e8,&local_db8,
                      &local_3a8);
  local_1370._M_dataplus._M_p = (pointer)&local_1370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1370,"font-file","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"path to ttf file, required","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_10a8,&__return_storage_ptr__->fontFile);
  local_dc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10a8
  ;
  local_dc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_10a0;
  local_10a8 = (element_type *)0x0;
  p_Stack_10a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_1370,&local_3c8,&local_dc8,&local_3e8);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_408,
             "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if \'chars-file\' option is not defined"
             ,"");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_10b8,&local_1028);
  local_dd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10b8
  ;
  local_dd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_10b0;
  local_10b8 = (element_type *)0x0;
  p_Stack_10b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_d88,&local_408,&local_dd8,&local_428);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,
             "optional path to UTF-8 text file with required characters (will be combined with \'chars\' option)"
             ,"");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cxxopts *)&local_10c8,&local_1088);
  local_de8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10c8
  ;
  local_de8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_10c0;
  local_10c8 = (element_type *)0x0;
  p_Stack_10c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_1048,&local_448,&local_de8,&local_468);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"color","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,
             "foreground RGB color, for example: 32,255,255, default value is 255,255,255","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_e08,&local_348);
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"255,255,255","");
  (**(code **)(*local_e08 + 0x50))(&local_10d8,local_e08,local_4c8);
  local_df8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10d8
  ;
  local_df8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_10d0;
  local_10d8 = (element_type *)0x0;
  p_Stack_10d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_488,&local_4a8,&local_df8,&local_4e8);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,
             "background color RGB color, for example: 0,0,128, transparent by default","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_10e8,&local_388);
  local_e18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10e8
  ;
  local_e18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_10e0;
  local_10e8 = (element_type *)0x0;
  p_Stack_10e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_d68,&local_508,&local_e18,&local_528);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"font-size","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_568,"font size, default value is 32","");
  cxxopts::value<unsigned_short>((cxxopts *)&local_e38,&__return_storage_ptr__->fontSize);
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"32","");
  (**(code **)(*local_e38 + 0x50))(&local_10f8,local_e38,local_588);
  local_e28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_10f8
  ;
  local_e28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_10f0;
  local_10f8 = (element_type *)0x0;
  p_Stack_10f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_548,&local_568,&local_e28,&local_5a8);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"padding-up","");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e8,"padding up, default value is 0","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_e58,&(__return_storage_ptr__->padding).up);
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"0","");
  (**(code **)(*local_e58 + 0x50))(&local_1108,local_e58,local_608);
  local_e48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1108
  ;
  local_e48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1100;
  local_1108 = (element_type *)0x0;
  p_Stack_1100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_5c8,&local_5e8,&local_e48,&local_628);
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"padding-right","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_668,"padding right, default value is 0","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_e78,&(__return_storage_ptr__->padding).right);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"0","");
  (**(code **)(*local_e78 + 0x50))(&local_1118,local_e78,local_688);
  local_e68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1118
  ;
  local_e68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1110;
  local_1118 = (element_type *)0x0;
  p_Stack_1110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_648,&local_668,&local_e68,&local_6a8);
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"padding-down","");
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6e8,"padding down, default value is 0","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_e98,&(__return_storage_ptr__->padding).down);
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"0","");
  (**(code **)(*local_e98 + 0x50))(&local_1128,local_e98,local_708);
  local_e88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1128
  ;
  local_e88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1120;
  local_1128 = (element_type *)0x0;
  p_Stack_1120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_6c8,&local_6e8,&local_e88,&local_728);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"padding-left","");
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"padding left, default value is 0","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_eb8,&(__return_storage_ptr__->padding).left);
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"0","");
  (**(code **)(*local_eb8 + 0x50))(&local_1138,local_eb8,local_788);
  local_ea8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1138
  ;
  local_ea8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1130;
  local_1138 = (element_type *)0x0;
  p_Stack_1130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_748,&local_768,&local_ea8,&local_7a8);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"spacing-vert","");
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7e8,"spacing vert, default value is 0","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_ed8,&(__return_storage_ptr__->spacing).ver);
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"0","");
  (**(code **)(*local_ed8 + 0x50))(&local_1148,local_ed8,local_808);
  local_ec8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1148
  ;
  local_ec8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1140;
  local_1148 = (element_type *)0x0;
  p_Stack_1140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_7c8,&local_7e8,&local_ec8,&local_828);
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"spacing-horiz","");
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_868,"spacing horiz, default value is 0","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_ef8,&(__return_storage_ptr__->spacing).hor);
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"0","");
  (**(code **)(*local_ef8 + 0x50))(&local_1158,local_ef8,local_888);
  local_ee8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1158
  ;
  local_ee8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1150;
  local_1158 = (element_type *)0x0;
  p_Stack_1150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_848,&local_868,&local_ee8,&local_8a8);
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"output","");
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e8,"output files name without extension, required","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_1168,&__return_storage_ptr__->output);
  local_f08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1168._M_nxt;
  local_f08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1160;
  local_1168._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_1160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_8c8,&local_8e8,&local_f08,&local_908);
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"data-format","");
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_948,
             "output data file format: \"txt\", \"xml\", \"json\", \"bin\", \"cbor\", default: \"txt\""
             ,"");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_f28,&local_1330);
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"txt","");
  (**(code **)(*local_f28 + 0x50))(&local_1178,local_f28,local_968);
  local_f18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1178
  ;
  local_f18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1170;
  local_1178 = (element_type *)0x0;
  p_Stack_1170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_928,&local_948,&local_f18,&local_988);
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"kerning-pairs","");
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9c8,
             "\"generate kerning pairs: \"disabled\", \"basic\", \"regular\" (tuned by hinter), \"extended\" (bigger output size, but more precise), default: \"disabled\""
             ,"");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_f48,&local_1308);
  local_9e8[0] = local_9d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"disabled","");
  (**(code **)(*local_f48 + 0x50))(&local_1188,local_f48,local_9e8);
  local_f38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1188
  ;
  local_f38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1180;
  local_1188 = (element_type *)0x0;
  p_Stack_1180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_9a8,&local_9c8,&local_f38,&local_a08);
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"monochrome","");
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"disable anti-aliasing","");
  cxxopts::value<bool>((cxxopts *)&local_1198,&__return_storage_ptr__->monochrome);
  local_f58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1198
  ;
  local_f58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1190;
  local_1198 = (element_type *)0x0;
  p_Stack_1190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a68,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_a28,&local_a48,&local_f58,&local_a68);
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"extra-info","");
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_aa8,"write extra information to data file","");
  cxxopts::value<bool>((cxxopts *)&local_11a8,&__return_storage_ptr__->extraInfo);
  local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_11a8;
  local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_11a0;
  local_11a8 = (_Base_ptr)0x0;
  p_Stack_11a0 = (_Base_ptr)0x0;
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_a88,&local_aa8,&local_f68,&local_ac8);
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ae8,
             "list of texture sizes (will be tried from left to right to fit glyphs)","");
  cxxopts::value<std::__cxx11::string>((cxxopts *)local_11b8,&local_368);
  local_f78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_11b8._0_8_;
  local_f78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8._8_8_;
  local_11b8._0_8_ = 0;
  local_11b8._8_8_ = (_Base_ptr)0x0;
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_da8,&local_ae8,&local_f78,&local_b08);
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b28,"texture-crop-width","");
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b48,"crop unused parts of output textures (width)","");
  cxxopts::value<bool>((cxxopts *)&local_11c8,&__return_storage_ptr__->cropTexturesWidth);
  local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_11c8
  ;
  local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_11c0;
  local_11c8 = (element_type *)0x0;
  p_Stack_11c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_b28,&local_b48,&local_f88,&local_b68);
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b88,"texture-crop-height","");
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ba8,"crop unused parts of output textures (height)","");
  cxxopts::value<bool>((cxxopts *)&local_11d8,&__return_storage_ptr__->cropTexturesHeight);
  local_f98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_11d8._0_8_;
  local_f98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11d8._M_next_resize;
  local_11d8._M_max_load_factor = 0.0;
  local_11d8._4_4_ = 0;
  local_11d8._M_next_resize = 0;
  local_bc8._M_dataplus._M_p = (pointer)&local_bc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_b88,&local_ba8,&local_f98,&local_bc8);
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"align-horiz","");
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c08,"align glyph horizontal position","");
  local_1310 = &(__return_storage_ptr__->alignment).hor;
  cxxopts::value<unsigned_int>((cxxopts *)&local_11e8,local_1310);
  local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_11e8._M_nxt;
  local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_11e0;
  local_11e8._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_11e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_be8,&local_c08,&local_fa8,&local_c28);
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"align-vert","");
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c68,"align glyph vertical position","");
  local_1000 = &__return_storage_ptr__->alignment;
  cxxopts::value<unsigned_int>((cxxopts *)&local_11f8,&local_1000->ver);
  local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_11f8
  ;
  local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_11f0;
  local_11f8 = (element_type *)0x0;
  p_Stack_11f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_c48,&local_c68,&local_fb8,&local_c88);
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"verbose","");
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"verbose output","");
  cxxopts::value<bool>((cxxopts *)&local_1208,&__return_storage_ptr__->verbose);
  local_fc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1208;
  local_fc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1200;
  local_1208 = (pointer)0x0;
  pbStack_1200 = (pointer)0x0;
  local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_ca8,&local_cc8,&local_fc8,&local_ce8);
  local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d08,"max-texture-count","");
  local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d28,"maximum generated textures","");
  cxxopts::value<unsigned_int>((cxxopts *)&local_1218,&__return_storage_ptr__->maxTextureCount);
  local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1218._M_pi;
  local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1210;
  local_1218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbStack_1210 = (pointer)0x0;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
  pOVar9 = cxxopts::OptionAdder::operator()(pOVar9,&local_d08,&local_d28,&local_fd8,&local_208);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"texture-name-suffix","");
  local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d48,
             "texture name suffix: \"index_aligned\", \"index\", \"none\", default: \"index_aligned\""
             ,"");
  cxxopts::value<std::__cxx11::string>((cxxopts *)&local_ff8,&local_1068);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"index_aligned","");
  (**(code **)(*local_ff8 + 0x50))(&local_1228,local_ff8,local_248);
  local_fe8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1228
  ;
  local_fe8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1220;
  local_1228 = (element_type *)0x0;
  p_Stack_1220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
  cxxopts::OptionAdder::operator()(pOVar9,&local_228,&local_d48,&local_fe8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_fe8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fe8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1220);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  if (local_ff0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ff0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if (local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (pbStack_1210 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
    operator_delete(local_ce8._M_dataplus._M_p);
  }
  if (local_fc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (pbStack_1200 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_11f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_11f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p);
  }
  if (local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fa8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_11e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_11e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc8._M_dataplus._M_p != &local_bc8.field_2) {
    operator_delete(local_bc8._M_dataplus._M_p);
  }
  if (local_f98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11d8._M_next_resize !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11d8._M_next_resize);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p);
  }
  if (local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_11c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_11c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p);
  }
  if (local_f78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Base_ptr)local_11b8._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_11b8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p);
  }
  if (local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_11a0 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_11a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p);
  }
  if (local_f58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p);
  }
  if (local_f38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1180);
  }
  if (local_9e8[0] != local_9d8) {
    operator_delete(local_9e8[0]);
  }
  if (local_f40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p);
  }
  if (local_f18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1170);
  }
  if (local_968[0] != local_958) {
    operator_delete(local_968[0]);
  }
  if (local_f20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f20);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p);
  }
  if (local_f08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1160);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p);
  }
  if (local_ee8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ee8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1150);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0]);
  }
  if (local_ef0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ef0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  if (local_ec8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ec8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1140);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0]);
  }
  if (local_ed0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ed0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if (local_ea8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ea8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1130);
  }
  if (local_788[0] != local_778) {
    operator_delete(local_788[0]);
  }
  if (local_eb0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_eb0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p);
  }
  if (local_e88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1120);
  }
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0]);
  }
  if (local_e90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if (local_e68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1110);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0]);
  }
  if (local_e70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  if (local_e48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1100);
  }
  if (local_608[0] != local_5f8) {
    operator_delete(local_608[0]);
  }
  if (local_e50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if (local_e28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_10f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10f0);
  }
  if (local_588[0] != local_578) {
    operator_delete(local_588[0]);
  }
  if (local_e30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p);
  }
  if (local_e18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_10e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if (local_df8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_10d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10d0);
  }
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0]);
  }
  if (local_e00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if (local_de8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_de8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_10c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  if (local_dd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_dd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_10b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  if (local_dc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_dc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_10a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1370._M_dataplus._M_p != &local_1370.field_2) {
    operator_delete(local_1370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_db8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_db8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1090 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1090);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
    operator_delete(local_12e8._M_dataplus._M_p);
  }
  if ((__node_base *)local_328.m_keys._M_h._M_buckets != &local_328.m_keys._M_h._M_before_begin) {
    operator_delete(local_328.m_keys._M_h._M_buckets);
  }
  if ((__node_base *)local_12c8._8_8_ != (__node_base *)(local_12b8 + 8)) {
    operator_delete((void *)local_12c8._8_8_);
  }
  if (local_1350 != &local_1340) {
    operator_delete(local_1350);
  }
  local_12c8._8_8_ = &local_1a8.m_positional;
  local_1298._0_8_ = local_1268;
  local_12c8._0_8_ =
       local_1a8.m_options.
       super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_12b8 = (undefined1  [8])0x0;
  auStack_12b0._0_8_ = (_Base_ptr)0x0;
  stack0xffffffffffffed58 = (_Base_ptr)0x0;
  bStack_12a0 = local_1a8.m_allow_unrecognised;
  local_1298._8_8_ = 1;
  local_1298._16_8_ = (_Hash_node_base *)0x0;
  local_1298._24_8_ = 0;
  local_1278._M_p = (pointer)0x3f800000;
  local_1268._8_8_ = &local_1230;
  sStack_1270 = 0;
  local_1268._0_8_ = (__node_base_ptr)0x0;
  _Stack_1258._M_p = (pointer)0x1;
  local_1250._M_nxt = (_Hash_node_base *)0x0;
  aStack_1248._M_allocated_capacity = 0;
  aStack_1248._8_8_ = 0x3f800000;
  sStack_1238 = 0;
  local_1230 = (__node_base_ptr)0x0;
  cxxopts::OptionParser::parse(&local_328,(OptionParser *)local_12c8,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1268 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1298);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_12b8);
  local_12c8._0_8_ = (Options *)local_12b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"help","");
  sVar10 = cxxopts::ParseResult::count(&local_328,(string *)local_12c8);
  if ((Options *)local_12c8._0_8_ != (Options *)local_12b8) {
    operator_delete((void *)local_12c8._0_8_);
  }
  if (sVar10 != 0) {
    local_12e8._M_dataplus._M_p = (pointer)0x0;
    local_12e8._M_string_length = 0;
    local_12e8.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_12c8,&local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_12e8);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_12c8._0_8_,local_12c8._8_8_);
    std::endl<char,std::char_traits<char>>(poVar11);
    if ((Options *)local_12c8._0_8_ != (Options *)local_12b8) {
      operator_delete((void *)local_12c8._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_12e8);
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_001918f8;
    pcVar14 = std::exception::~exception;
    ppuVar16 = &HelpException::typeinfo;
    goto LAB_0014a110;
  }
  local_12c8._0_8_ = (Options *)local_12b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"font-file","");
  sVar10 = cxxopts::ParseResult::count(&local_328,(string *)local_12c8);
  if ((Options *)local_12c8._0_8_ != (Options *)local_12b8) {
    operator_delete((void *)local_12c8._0_8_);
  }
  if (sVar10 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"--font-file required");
  }
  else {
    local_12c8._0_8_ = (Options *)local_12b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"output","");
    sVar10 = cxxopts::ParseResult::count(&local_328,(string *)local_12c8);
    if ((Options *)local_12c8._0_8_ != (Options *)local_12b8) {
      operator_delete((void *)local_12c8._0_8_);
    }
    if (sVar10 == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"--output required");
    }
    else {
      local_12c8._0_8_ = (Options *)local_12b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"max-texture-count","");
      sVar10 = cxxopts::ParseResult::count(&local_328,(string *)local_12c8);
      __return_storage_ptr__->useMaxTextureCount = sVar10 != 0;
      if ((Options *)local_12c8._0_8_ != (Options *)local_12b8) {
        operator_delete((void *)local_12c8._0_8_);
      }
      sVar10 = cxxopts::ParseResult::count(&local_328,&local_d88);
      if ((sVar10 == 0) &&
         (sVar10 = cxxopts::ParseResult::count(&local_328,&local_1048), sVar10 == 0)) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_1028,0,(char *)local_1028._M_string_length,0x178c81);
      }
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_1028._M_dataplus._M_p,
                 (char *)(local_1028._M_string_length + (long)local_1028._M_dataplus._M_p));
      parseCharsString((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_12c8,&local_288);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&(__return_storage_ptr__->chars)._M_t);
      if (local_12b8 != (undefined1  [8])0x0) {
        (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_12c8._8_4_;
        (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_12b8;
        (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)auStack_12b0._0_8_;
        (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)stack0xffffffffffffed58;
        *(_Base_ptr *)((long)local_12b8 + 8) = local_1008;
        (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             _bStack_12a0;
        local_12b8 = (undefined1  [8])0x0;
        _bStack_12a0 = 0;
        auStack_12b0._0_8_ = (_Base_ptr)(local_12c8 + 8);
        unique0x1000647b = (_Base_ptr)(local_12c8 + 8);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_12c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      sVar10 = cxxopts::ParseResult::count(&local_328,&local_1048);
      pbVar6 = local_1088.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      fileName = local_1088.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (sVar10 != 0) {
        for (; fileName != pbVar6; fileName = fileName + 1) {
          getCharsFromFile(fileName,&__return_storage_ptr__->chars);
        }
      }
      CVar7 = parseColor(&local_348);
      (__return_storage_ptr__->color).r = (char)CVar7._0_2_;
      (__return_storage_ptr__->color).g = (char)((ushort)CVar7._0_2_ >> 8);
      (__return_storage_ptr__->color).b = CVar7.b;
      sVar10 = cxxopts::ParseResult::count(&local_328,&local_d68);
      __return_storage_ptr__->backgroundTransparent = sVar10 == 0;
      if (sVar10 != 0) {
        CVar7 = parseColor(&local_388);
        (__return_storage_ptr__->backgroundColor).r = (char)CVar7._0_2_;
        (__return_storage_ptr__->backgroundColor).g = (char)((ushort)CVar7._0_2_ >> 8);
        (__return_storage_ptr__->backgroundColor).b = CVar7.b;
      }
      sVar5 = local_1330._M_string_length;
      _Var4._M_p = local_1330._M_dataplus._M_p;
      if (local_1330._M_string_length != 0) {
        sVar17 = 0;
        do {
          iVar8 = tolower((int)_Var4._M_p[sVar17]);
          _Var4._M_p[sVar17] = (char)iVar8;
          sVar17 = sVar17 + 1;
        } while (sVar5 != sVar17);
      }
      iVar8 = std::__cxx11::string::compare((char *)&local_1330);
      if (iVar8 == 0) {
        DVar12 = Text;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_1330);
        if (iVar8 == 0) {
          DVar12 = Xml;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&local_1330);
          if (iVar8 == 0) {
            DVar12 = Bin;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_1330);
            if (iVar8 == 0) {
              DVar12 = Json;
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_1330);
              DVar12 = Cbor;
              if (iVar8 != 0) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"unknown --data-format value");
                goto LAB_0014a102;
              }
            }
          }
        }
      }
      sVar5 = local_1308._M_string_length;
      _Var4._M_p = local_1308._M_dataplus._M_p;
      __return_storage_ptr__->dataFormat = DVar12;
      if (local_1308._M_string_length != 0) {
        sVar17 = 0;
        do {
          iVar8 = tolower((int)_Var4._M_p[sVar17]);
          _Var4._M_p[sVar17] = (char)iVar8;
          sVar17 = sVar17 + 1;
        } while (sVar5 != sVar17);
      }
      iVar8 = std::__cxx11::string::compare((char *)&local_1308);
      TVar15 = IndexAligned;
      KVar13 = Disabled;
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare((char *)&local_1308);
        if (iVar8 == 0) {
          KVar13 = Basic;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&local_1308);
          if (iVar8 == 0) {
            KVar13 = Regular;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_1308);
            KVar13 = Extended;
            if (iVar8 != 0) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"unknown --kerning-pairs value");
              goto LAB_0014a102;
            }
          }
        }
      }
      __return_storage_ptr__->kerningPairs = KVar13;
      iVar8 = std::__cxx11::string::compare((char *)&local_1068);
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare((char *)&local_1068);
        if (iVar8 == 0) {
          TVar15 = Index;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&local_1068);
          TVar15 = None;
          if (iVar8 != 0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"unknown --texture-name-suffix value");
            goto LAB_0014a102;
          }
        }
      }
      __return_storage_ptr__->textureNameSuffix = TVar15;
      sVar10 = cxxopts::ParseResult::count(&local_328,&local_da8);
      if (sVar10 == 0) {
        local_12c8._0_8_ = (Options *)0x2000000020;
        local_12c8._8_8_ = (pointer)0x2000000040;
        local_12b8 = (undefined1  [8])0x4000000040;
        auStack_12b0._0_8_ = (_Base_ptr)0x4000000080;
        stack0xffffffffffffed58 = (_Base_ptr)0x8000000080;
        _bStack_12a0 = 0x8000000100;
        local_1298._0_8_ = (__buckets_ptr)0x10000000100;
        local_1298._8_8_ = 0x10000000200;
        local_1298._16_8_ = (_Hash_node_base *)0x20000000200;
        local_1298._24_8_ = 0x20000000400;
        local_1278._M_p = (pointer)0x40000000400;
        sStack_1270 = 0x40000000800;
        local_1268._0_8_ = (__node_base_ptr)0x80000000800;
        std::vector<Config::Size,std::allocator<Config::Size>>::_M_assign_aux<Config::Size_const*>
                  ((vector<Config::Size,std::allocator<Config::Size>> *)
                   &__return_storage_ptr__->textureSizeList,local_12c8);
      }
      else {
        parseTextureSize((vector<Config::Size,_std::allocator<Config::Size>_> *)local_12c8,
                         &local_368);
        pSVar3 = (__return_storage_ptr__->textureSizeList).
                 super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->textureSizeList).
        super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_12c8._0_8_;
        (__return_storage_ptr__->textureSizeList).
        super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_12c8._8_8_;
        (__return_storage_ptr__->textureSizeList).
        super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_12b8;
        local_12c8._0_8_ = (Options *)0x0;
        local_12c8._8_8_ = (pointer)0x0;
        local_12b8 = (undefined1  [8])0x0;
        if (pSVar3 != (pointer)0x0) {
          operator_delete(pSVar3);
        }
        if ((Options *)local_12c8._0_8_ != (Options *)0x0) {
          operator_delete((void *)local_12c8._0_8_);
        }
      }
      if (*local_1310 == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid --align-horiz");
      }
      else {
        if (local_1000->ver != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_328.m_unmatched);
          std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
                    (&local_328.m_sequential);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_328.m_values._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_328);
          cxxopts::Options::~Options(&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1068._M_dataplus._M_p != &local_1068.field_2) {
            operator_delete(local_1068._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
            operator_delete(local_1308._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1330._M_dataplus._M_p != &local_1330.field_2) {
            operator_delete(local_1330._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
            operator_delete(local_da8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
            operator_delete(local_d88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1048._M_dataplus._M_p != &local_1048.field_2) {
            operator_delete(local_1048._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
            operator_delete(local_d68._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1088);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1028._M_dataplus._M_p != &local_1028.field_2) {
            operator_delete(local_1028._M_dataplus._M_p);
          }
          return __return_storage_ptr__;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid --align-vert");
      }
    }
  }
LAB_0014a102:
  pcVar14 = std::runtime_error::~runtime_error;
  ppuVar16 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
LAB_0014a110:
  __cxa_throw(this,ppuVar16,pcVar14);
}

Assistant:

Config ProgramOptions::parseCommandLine(int argc, char* argv[])
{
    try
    {
        Config config;
        std::string chars;
        std::vector<std::string> charsFile;
        std::string color;
        std::string textureSizeList;
        std::string backgroundColor;
        const std::string backgroundColorOptionName = "background-color";
        const std::string charsFileOptionName = "chars-file";
        const std::string charsOptionName = "chars";
        const std::string textureSizeListOptionName = "texture-size";
        std::string dataFormat;
        std::string kerningPairs;
        std::string textureNameSuffix;

        cxxopts::Options options("fontbm", "Command line bitmap font generator, compatible with bmfont");
        options.add_options()
            ("help", "produce help message")
            ("font-file", "path to ttf file, required", cxxopts::value<std::string>(config.fontFile))
            (charsOptionName, "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if 'chars-file' option is not defined", cxxopts::value<std::string>(chars))
            (charsFileOptionName, "optional path to UTF-8 text file with required characters (will be combined with 'chars' option)", cxxopts::value<std::vector<std::string>>(charsFile))
            ("color", "foreground RGB color, for example: 32,255,255, default value is 255,255,255", cxxopts::value<std::string>(color)->default_value("255,255,255"))
            (backgroundColorOptionName, "background color RGB color, for example: 0,0,128, transparent by default", cxxopts::value<std::string>(backgroundColor))
            ("font-size", "font size, default value is 32", cxxopts::value<std::uint16_t>(config.fontSize)->default_value("32"))
            ("padding-up", "padding up, default value is 0", cxxopts::value<std::uint32_t>(config.padding.up)->default_value("0"))
            ("padding-right", "padding right, default value is 0", cxxopts::value<std::uint32_t>(config.padding.right)->default_value("0"))
            ("padding-down", "padding down, default value is 0", cxxopts::value<std::uint32_t>(config.padding.down)->default_value("0"))
            ("padding-left", "padding left, default value is 0", cxxopts::value<std::uint32_t>(config.padding.left)->default_value("0"))
            ("spacing-vert", "spacing vert, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.ver)->default_value("0"))
            ("spacing-horiz", "spacing horiz, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.hor)->default_value("0"))
            ("output", "output files name without extension, required", cxxopts::value<std::string>(config.output))
            ("data-format", R"(output data file format: "txt", "xml", "json", "bin", "cbor", default: "txt")", cxxopts::value<std::string>(dataFormat)->default_value("txt"))
            ("kerning-pairs", R"("generate kerning pairs: "disabled", "basic", "regular" (tuned by hinter), "extended" (bigger output size, but more precise), default: "disabled")", cxxopts::value<std::string>(kerningPairs)->default_value("disabled"))
            ("monochrome", "disable anti-aliasing", cxxopts::value<bool>(config.monochrome))
            ("extra-info", "write extra information to data file", cxxopts::value<bool>(config.extraInfo))
            (textureSizeListOptionName, "list of texture sizes (will be tried from left to right to fit glyphs)", cxxopts::value<std::string>(textureSizeList))
            ("texture-crop-width", "crop unused parts of output textures (width)", cxxopts::value<bool>(config.cropTexturesWidth))
            ("texture-crop-height", "crop unused parts of output textures (height)", cxxopts::value<bool>(config.cropTexturesHeight))
            ("align-horiz", "align glyph horizontal position", cxxopts::value<std::uint32_t>(config.alignment.hor))
            ("align-vert", "align glyph vertical position", cxxopts::value<std::uint32_t>(config.alignment.ver))
            ("verbose", "verbose output", cxxopts::value<bool>(config.verbose))
            ("max-texture-count", "maximum generated textures", cxxopts::value<std::uint32_t>(config.maxTextureCount))
            ("texture-name-suffix", R"(texture name suffix: "index_aligned", "index", "none", default: "index_aligned")", cxxopts::value<std::string>(textureNameSuffix)->default_value("index_aligned"))
            ;

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            throw HelpException();
        }

        if (!result.count("font-file"))
            throw std::runtime_error("--font-file required");
        if (!result.count("output"))
            throw std::runtime_error("--output required");

        config.useMaxTextureCount = result.count("max-texture-count");

        if (!result.count(charsOptionName) && !result.count(charsFileOptionName))
            chars = "32-126";
        config.chars = parseCharsString(chars);
        if (result.count(charsFileOptionName))
            for (const auto& f : charsFile)
                getCharsFromFile(f, config.chars);

        config.color = parseColor(color);
        config.backgroundTransparent = result.count(backgroundColorOptionName) == 0;
        if (!config.backgroundTransparent)
            config.backgroundColor = parseColor(backgroundColor);

        std::transform(dataFormat.begin(), dataFormat.end(), dataFormat.begin(), tolower);

        if (dataFormat == "txt")
            config.dataFormat = Config::DataFormat::Text;
        else if (dataFormat == "xml")
            config.dataFormat = Config::DataFormat::Xml;
        else if (dataFormat == "bin")
            config.dataFormat = Config::DataFormat::Bin;
        else if (dataFormat == "json")
            config.dataFormat = Config::DataFormat::Json;
        else if (dataFormat == "cbor")
            config.dataFormat = Config::DataFormat::Cbor;
        else
            throw std::runtime_error("unknown --data-format value");

        std::transform(kerningPairs.begin(), kerningPairs.end(), kerningPairs.begin(), tolower);
        if (kerningPairs == "disabled")
            config.kerningPairs = Config::KerningPairs::Disabled;
        else if (kerningPairs == "basic")
            config.kerningPairs = Config::KerningPairs::Basic;
        else if (kerningPairs == "regular")
            config.kerningPairs = Config::KerningPairs::Regular;
        else if (kerningPairs == "extended")
            config.kerningPairs = Config::KerningPairs::Extended;
        else
            throw std::runtime_error("unknown --kerning-pairs value");

        if (textureNameSuffix == "index_aligned")
            config.textureNameSuffix = Config::TextureNameSuffix::IndexAligned;
        else if (textureNameSuffix == "index")
            config.textureNameSuffix = Config::TextureNameSuffix::Index;
        else if (textureNameSuffix == "none")
            config.textureNameSuffix = Config::TextureNameSuffix::None;
        else
            throw std::runtime_error("unknown --texture-name-suffix value");

        if (result.count(textureSizeListOptionName))
            config.textureSizeList = parseTextureSize(textureSizeList);
        else
            config.textureSizeList = {
                {32, 32},
                {64, 32},
                {64, 64},
                {128, 64},
                {128, 128},
                {256, 128},
                {256, 256},
                {512, 256},
                {512, 512},
                {1024, 512},
                {1024, 1024},
                {2048, 1024},
                {2048, 2048}
        };

        if (!config.alignment.hor)
            throw std::runtime_error("invalid --align-horiz");
        if (!config.alignment.ver)
            throw std::runtime_error("invalid --align-vert");

        return config;
    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        throw std::exception();
    }
}